

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O3

void do_pload(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  CHAR_DATA *pCVar3;
  DESCRIPTOR_DATA *d;
  char *pcVar4;
  FILE *pFVar5;
  char cVar6;
  basic_string_view<char> fmt;
  string_view fmt_00;
  basic_string_view<char> fmt_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  int returnCode;
  string buffer;
  char name [4608];
  int local_14dc;
  _func_int **local_14d8 [2];
  _func_int *local_14c8 [2];
  long *local_14b8 [2];
  long local_14a8 [2];
  char *local_1498 [2];
  char *local_1488;
  char *local_1478;
  char *local_1468;
  buffer<char> local_1450;
  char local_1430 [504];
  char local_1238 [4616];
  
  pcVar2 = one_argument(argument,local_1238);
  if ((local_1238[0] == '\0') || (*pcVar2 == '\0')) {
    pcVar2 = "Syntax: pload <char> <command>\n\r";
  }
  else {
    cVar6 = local_1238[0] + -0x20;
    if (0x19 < (byte)(local_1238[0] + 0x9fU)) {
      cVar6 = local_1238[0];
    }
    local_1238[0] = cVar6;
    pCVar3 = get_char_world(ch,local_1238);
    if (pCVar3 == (CHAR_DATA *)0x0) {
      d = new_descriptor();
      bVar1 = load_char_obj(d,local_1238);
      if (bVar1) {
        local_1498[0] = "../player";
        local_1478 = ".plr";
        local_1468 = "../player";
        local_1450.size_ = 0;
        local_1450._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
        local_1450.capacity_ = 500;
        fmt.size_ = 0x15;
        fmt.data_ = "cp {}{}{} {}pload.txt";
        args.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_1498;
        args.desc_ = 0xcccc;
        local_1488 = local_1238;
        local_1450.ptr_ = local_1430;
        ::fmt::v9::detail::vformat_to<char>(&local_1450,fmt,args,(locale_ref)0x0);
        local_14d8[0] = local_14c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_14d8,local_1450.ptr_,local_1450.ptr_ + local_1450.size_);
        if (local_1450.ptr_ != local_1430) {
          operator_delete(local_1450.ptr_,local_1450.capacity_);
        }
        local_14dc = system((char *)local_14d8[0]);
        if (local_14dc != 0) {
          local_1450._vptr_buffer = local_14d8[0];
          fmt_00._M_str = "Command [{}] failed with exit code [{}]";
          fmt_00._M_len = 0x27;
          CLogger::Warn<char*,int&>
                    ((CLogger *)&RS.field_0x140,fmt_00,(char **)&local_1450,&local_14dc);
        }
        pCVar3 = d->character;
        pCVar3->desc = (DESCRIPTOR_DATA *)0x0;
        pCVar3->next = char_list;
        char_list = pCVar3;
        d->outsize = 2000;
        pcVar4 = (char *)operator_new__(2000);
        d->outbuf = pcVar4;
        d->connected = 0;
        reset_char(pCVar3);
        pCVar3 = d->character;
        pcVar4 = palloc_string("PLOAD");
        d->character->pcdata->host = pcVar4;
        interpret(ch,pcVar2);
        local_1498[0] = "../player";
        local_1488 = local_1238;
        local_1478 = ".plr";
        local_1450.size_ = 0;
        local_1450._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
        local_1450.capacity_ = 500;
        fmt_01.size_ = 7;
        fmt_01.data_ = "{}/{}{}";
        args_00.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_1498;
        args_00.desc_ = 0xccc;
        local_1450.ptr_ = local_1430;
        ::fmt::v9::detail::vformat_to<char>(&local_1450,fmt_01,args_00,(locale_ref)0x0);
        local_14b8[0] = local_14a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_14b8,local_1450.ptr_,local_1450.ptr_ + local_1450.size_);
        if (local_1450.ptr_ != local_1430) {
          operator_delete(local_1450.ptr_,local_1450.capacity_);
        }
        std::__cxx11::string::operator=((string *)local_14d8,(string *)local_14b8);
        if (local_14b8[0] != local_14a8) {
          operator_delete(local_14b8[0],local_14a8[0] + 1);
        }
        pFVar5 = fopen((char *)local_14d8[0],"r");
        if (pFVar5 != (FILE *)0x0) {
          save_char_obj(pCVar3);
          extract_char(pCVar3,true);
        }
        free_descriptor(d);
        if (local_14d8[0] == local_14c8) {
          return;
        }
        operator_delete(local_14d8[0],(ulong)(local_14c8[0] + 1));
        return;
      }
      pcVar2 = "No such character exists.\n\r";
    }
    else {
      pcVar2 = "That character is already online!\n\r";
    }
  }
  send_to_char(pcVar2,ch);
  return;
}

Assistant:

void do_pload(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char name[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, name);

	if (name[0] == '\0' || argument[0] == '\0')
	{
		send_to_char("Syntax: pload <char> <command>\n\r", ch);
		return;
	}

	name[0] = UPPER(name[0]);

	if (get_char_world(ch, name) != nullptr)
	{
		send_to_char("That character is already online!\n\r", ch);
		return;
	}

	d = new_descriptor();

	if (!load_char_obj(d, name))
	{
		send_to_char("No such character exists.\n\r", ch);
		return;
	}

	auto buffer = fmt::format("cp {}{}{} {}pload.txt", RIFT_PLAYER_DIR, name, ".plr", RIFT_PLAYER_DIR);

	auto returnCode = system(buffer.c_str());
	if(returnCode != 0) // cp returns 0 on SUCCESS, 1 on ERROR. system returns -1 on ERROR
		RS.Logger.Warn("Command [{}] failed with exit code [{}]", buffer.data(), returnCode);

	d->character->desc = nullptr;
	d->character->next = char_list;

	char_list = d->character;

	d->outsize = 2000;
	d->outbuf = new char[d->outsize];
	d->connected = CON_PLAYING;

	reset_char(d->character);

	victim = d->character;

	d->character->pcdata->host = palloc_string("PLOAD");

	interpret(ch, argument);

	buffer = fmt::format("{}/{}{}", RIFT_PLAYER_DIR, name, ".plr");

	if (fopen(buffer.c_str(), "r") != nullptr)
	{
		save_char_obj(victim);
		extract_char(victim, true);
	}

	free_descriptor(d);
}